

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

void __thiscall DFrameBuffer::DrawRateStuff(DFrameBuffer *this)

{
  FFont *font;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32 uVar5;
  int iVar6;
  int iVar7;
  BYTE *pBVar8;
  int size;
  BYTE *buffer;
  int tics;
  int i;
  DWORD thisSec;
  int textScale;
  int rate_x;
  int chars;
  char fpsbuff [40];
  DWORD howlong;
  DWORD ms;
  DFrameBuffer *this_local;
  
  bVar1 = FBoolCVar::operator_cast_to_bool(&vid_fps);
  if (bVar1) {
    uVar2 = I_FPSTime();
    uVar3 = uVar2 - this->LastMS;
    if (-1 < (int)uVar3) {
      i = active_con_scale();
      if (i == 0) {
        i = CleanXfac;
      }
      mysnprintf((char *)&rate_x,0x28,"%2u ms (%3u fps)",(ulong)uVar3,(ulong)this->LastCount);
      iVar7 = (this->super_DSimpleCanvas).super_DCanvas.Width;
      iVar6 = FFont::StringWidth(ConFont,(char *)&rate_x);
      iVar6 = iVar7 / i - iVar6;
      uVar3 = (this->super_DSimpleCanvas).super_DCanvas.Width;
      iVar7 = FFont::GetHeight(ConFont);
      (*(this->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                (this,(ulong)(uint)(iVar6 * i),0,(ulong)uVar3,(ulong)(uint)(iVar7 * i),
                 (ulong)GPalette.BlackIndex,0);
      font = ConFont;
      if (i == 1) {
        DCanvas::DrawText((DCanvas *)this,ConFont,9,iVar6,0,(char *)&rate_x,0);
      }
      else {
        iVar7 = DCanvas::GetWidth((DCanvas *)screen);
        iVar4 = DCanvas::GetHeight((DCanvas *)screen);
        DCanvas::DrawText((DCanvas *)this,font,9,iVar6,0,(char *)&rate_x,0x40001399,iVar7 / i,
                          0x4000139a,iVar4 / i,0x400013a8,1,0);
      }
      uVar3 = uVar2 / 1000;
      if (this->LastSec < uVar3) {
        this->LastCount = this->FrameCount / (uVar3 - this->LastSec);
        this->LastSec = uVar3;
        this->FrameCount = 0;
      }
      this->FrameCount = this->FrameCount + 1;
    }
    this->LastMS = uVar2;
  }
  bVar1 = FBoolCVar::operator_cast_to_bool(&ticker);
  if (bVar1) {
    uVar5 = (*I_GetTime)(false);
    buffer._0_4_ = uVar5 - this->LastTic;
    pBVar8 = DCanvas::GetBuffer((DCanvas *)this);
    this->LastTic = uVar5;
    if (0x14 < (int)buffer) {
      buffer._0_4_ = 0x14;
    }
    if (pBVar8 == (BYTE *)0x0) {
      for (buffer._4_4_ = 0;
          SBORROW4(buffer._4_4_,(int)buffer * 2) != (int)(buffer._4_4_ + (int)buffer * -2) < 0;
          buffer._4_4_ = buffer._4_4_ + 2) {
        (*(this->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                  (this,(ulong)buffer._4_4_,
                   (ulong)((this->super_DSimpleCanvas).super_DCanvas.Height - 1),
                   (ulong)(buffer._4_4_ + 1),
                   (ulong)(uint)(this->super_DSimpleCanvas).super_DCanvas.Height,0xff,0);
      }
      for (; (int)buffer._4_4_ < 0x28; buffer._4_4_ = buffer._4_4_ + 2) {
        (*(this->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                  (this,(ulong)buffer._4_4_,
                   (ulong)((this->super_DSimpleCanvas).super_DCanvas.Height - 1),
                   (ulong)(buffer._4_4_ + 1),
                   (ulong)(uint)(this->super_DSimpleCanvas).super_DCanvas.Height,0,0);
      }
    }
    else {
      iVar7 = DCanvas::GetHeight((DCanvas *)this);
      iVar6 = DCanvas::GetPitch((DCanvas *)this);
      iVar6 = (iVar7 + -1) * iVar6;
      for (buffer._4_4_ = 0;
          SBORROW4(buffer._4_4_,(int)buffer * 2) != (int)(buffer._4_4_ + (int)buffer * -2) < 0;
          buffer._4_4_ = buffer._4_4_ + 2) {
        pBVar8[(long)(int)buffer._4_4_ + (long)iVar6] = 0xff;
      }
      for (; (int)buffer._4_4_ < 0x28; buffer._4_4_ = buffer._4_4_ + 2) {
        pBVar8[(long)(int)buffer._4_4_ + (long)iVar6] = '\0';
      }
    }
  }
  iVar7 = FIntCVar::operator_cast_to_int(&vid_showpalette);
  if (iVar7 != 0) {
    if ((DrawRateStuff()::palette == '\0') &&
       (iVar7 = __cxa_guard_acquire(&DrawRateStuff()::palette), iVar7 != 0)) {
      FPaletteTester::FPaletteTester(&DrawRateStuff::palette);
      __cxa_atexit(FPaletteTester::~FPaletteTester,&DrawRateStuff::palette,&__dso_handle);
      __cxa_guard_release(&DrawRateStuff()::palette);
    }
    iVar7 = DCanvas::GetHeight((DCanvas *)screen);
    uVar2 = 0xe0;
    if (iVar7 < 800) {
      uVar2 = 0x70;
    }
    iVar7 = FIntCVar::operator_cast_to_int(&vid_showpalette);
    FPaletteTester::SetTranslation(&DrawRateStuff::palette,iVar7);
    DCanvas::DrawTexture
              ((DCanvas *)this,&DrawRateStuff::palette.super_FTexture,0.0,0.0,0x40001389,
               (ulong)uVar2,0x4000138a,(ulong)uVar2,0x400013a5,0,0);
  }
  return;
}

Assistant:

void DFrameBuffer::DrawRateStuff ()
{
	// Draws frame time and cumulative fps
	if (vid_fps)
	{
		DWORD ms = I_FPSTime();
		DWORD howlong = ms - LastMS;
		if ((signed)howlong >= 0)
		{
			char fpsbuff[40];
			int chars;
			int rate_x;

			int textScale = active_con_scale();
			if (textScale == 0)
				textScale = CleanXfac;

			chars = mysnprintf (fpsbuff, countof(fpsbuff), "%2u ms (%3u fps)", howlong, LastCount);
			rate_x = Width / textScale - ConFont->StringWidth(&fpsbuff[0]);
			Clear (rate_x * textScale, 0, Width, ConFont->GetHeight() * textScale, GPalette.BlackIndex, 0);
			if (textScale == 1)
				DrawText (ConFont, CR_WHITE, rate_x, 0, (char *)&fpsbuff[0], TAG_DONE);
			else
				DrawText (ConFont, CR_WHITE, rate_x, 0, (char *)&fpsbuff[0],
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);

			DWORD thisSec = ms/1000;
			if (LastSec < thisSec)
			{
				LastCount = FrameCount / (thisSec - LastSec);
				LastSec = thisSec;
				FrameCount = 0;
			}
			FrameCount++;
		}
		LastMS = ms;
	}

	// draws little dots on the bottom of the screen
	if (ticker)
	{
		int i = I_GetTime(false);
		int tics = i - LastTic;
		BYTE *buffer = GetBuffer();

		LastTic = i;
		if (tics > 20) tics = 20;

		// Buffer can be NULL if we're doing hardware accelerated 2D
		if (buffer != NULL)
		{
			buffer += (GetHeight()-1) * GetPitch();
			
			for (i = 0; i < tics*2; i += 2)		buffer[i] = 0xff;
			for ( ; i < 20*2; i += 2)			buffer[i] = 0x00;
		}
		else
		{
			for (i = 0; i < tics*2; i += 2)		Clear(i, Height-1, i+1, Height, 255, 0);
			for ( ; i < 20*2; i += 2)			Clear(i, Height-1, i+1, Height, 0, 0);
		}
	}

	// draws the palette for debugging
	if (vid_showpalette)
	{
		// This used to just write the palette to the display buffer.
		// With hardware-accelerated 2D, that doesn't work anymore.
		// Drawing it as a texture does and continues to show how
		// well the PalTex shader is working.
		static FPaletteTester palette;
		int size = screen->GetHeight() < 800 ? 16 * 7 : 16 * 7 * 2;

		palette.SetTranslation(vid_showpalette);
		DrawTexture(&palette, 0, 0,
			DTA_DestWidth, size,
			DTA_DestHeight, size,
			DTA_Masked, false,
			TAG_DONE);
	}
}